

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

bool __thiscall QGraphicsItem::isObscured(QGraphicsItem *this,QRectF *rect)

{
  QGraphicsItemPrivate *pQVar1;
  QGraphicsScene *this_00;
  QGraphicsItem **ppQVar2;
  char cVar3;
  bool bVar4;
  long lVar5;
  qreal *pqVar6;
  QTransform *pQVar7;
  long lVar8;
  long in_FS_OFFSET;
  byte bVar9;
  QPolygonF local_100;
  QList<QGraphicsItem_*> local_e8;
  QRectF local_c8;
  QRectF local_a8;
  QTransform local_80;
  long local_30;
  
  bVar9 = 0;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr).d;
  if (pQVar1->scene == (QGraphicsScene *)0x0) {
    bVar4 = false;
  }
  else {
    local_a8.w._0_4_ = 0xffffffff;
    local_a8.w._4_4_ = 0xffffffff;
    local_a8.h._0_4_ = 0xffffffff;
    local_a8.h._4_4_ = 0xffffffff;
    local_a8.xp._0_4_ = 0xffffffff;
    local_a8.xp._4_4_ = 0xffffffff;
    local_a8.yp._0_4_ = 0xffffffff;
    local_a8.yp._4_4_ = 0xffffffff;
    (*this->_vptr_QGraphicsItem[3])(&local_a8,this);
    if (rect->h == 0.0 && rect->w == 0.0) {
      rect = &local_a8;
    }
    local_c8.xp = rect->xp;
    local_c8.yp = rect->yp;
    local_c8.w = rect->w;
    local_c8.h = rect->h;
    local_e8.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_e8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_e8.d.ptr = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = (QGraphicsScene *)pQVar1->scene;
    mapToScene(&local_100,this,&local_a8);
    pqVar6 = (qreal *)&DAT_00700e28;
    pQVar7 = &local_80;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      pQVar7->m_matrix[0][0] = *pqVar6;
      pqVar6 = pqVar6 + (ulong)bVar9 * -2 + 1;
      pQVar7 = (QTransform *)((long)pQVar7 + ((ulong)bVar9 * -2 + 1) * 8);
    }
    local_80._72_2_ = local_80._72_2_ & 0xfc00;
    QGraphicsScene::items
              (&local_e8,this_00,&local_100,IntersectsItemBoundingRect,DescendingOrder,&local_80);
    if (&(local_100.super_QList<QPointF>.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_100.super_QList<QPointF>.d.d)->super_QArrayData).ref_._q_value.
      super___atomic_base<int>._M_i =
           ((local_100.super_QList<QPointF>.d.d)->super_QArrayData).ref_._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_100.super_QList<QPointF>.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_100.super_QList<QPointF>.d.d)->super_QArrayData,0x10,0x10);
      }
    }
    ppQVar2 = local_e8.d.ptr;
    if ((undefined1 *)local_e8.d.size == (undefined1 *)0x0) {
      bVar4 = false;
    }
    else {
      lVar8 = local_e8.d.size << 3;
      lVar5 = 0;
      do {
        if (*(QGraphicsItem **)((long)ppQVar2 + lVar5) == this) {
          cVar3 = '\x02';
          bVar4 = false;
        }
        else {
          cVar3 = qt_QGraphicsItem_isObscured
                            (this,*(QGraphicsItem **)((long)ppQVar2 + lVar5),&local_c8);
          bVar4 = !(bool)cVar3;
        }
        if (!bVar4) goto LAB_005eccdf;
        lVar5 = lVar5 + 8;
      } while (lVar8 != lVar5);
      cVar3 = '\x02';
LAB_005eccdf:
      bVar4 = cVar3 != '\x02';
    }
    if (&(local_e8.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_e8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_e8.d.d)->super_QArrayData,8,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QGraphicsItem::isObscured(const QRectF &rect) const
{
    Q_D(const QGraphicsItem);
    if (!d->scene)
        return false;

    QRectF br = boundingRect();
    QRectF testRect = rect.isNull() ? br : rect;

    const auto items = d->scene->items(mapToScene(br), Qt::IntersectsItemBoundingRect);
    for (QGraphicsItem *item : items) {
        if (item == this)
            break;
        if (qt_QGraphicsItem_isObscured(this, item, testRect))
            return true;
    }
    return false;
}